

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O1

shared_ptr<SchemePort>
get_output_port(list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                *l,string *proc,size_t skip)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  SchemePort *__tmp;
  long lVar5;
  runtime_error *this_00;
  ulong in_RCX;
  _List_node_base *p_Var6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  element_type *extraout_RDX;
  pointer pcVar8;
  undefined1 auVar9 [16];
  shared_ptr<SchemePort> sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                current_output_port.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  (l->
  super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>).
  _M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)
       current_output_port.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var4 = current_output_port.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  (l->
  super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>).
  _M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)
       current_output_port.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var4._M_pi)->_M_use_count = (_Var4._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var4._M_pi)->_M_use_count = (_Var4._M_pi)->_M_use_count + 1;
    }
  }
  if (in_RCX < (proc->field_2)._M_allocated_capacity) {
    pcVar8 = (proc->_M_dataplus)._M_p;
    if ((long)in_RCX < 1) {
      if (in_RCX != 0) {
        do {
          pcVar8 = *(pointer *)(pcVar8 + 8);
          in_RCX = in_RCX + 1;
        } while (in_RCX != 0);
      }
    }
    else {
      do {
        pcVar8 = *(pointer *)pcVar8;
        in_RCX = in_RCX - 1;
      } while (in_RCX != 0);
    }
    if (*(long *)(pcVar8 + 0x10) == 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = _Var7._M_pi;
      auVar9 = auVar1 << 0x40;
    }
    else {
      auVar9 = __dynamic_cast(*(long *)(pcVar8 + 0x10),&SchemeObject::typeinfo,&SchemePort::typeinfo
                             );
    }
    lVar5 = auVar9._0_8_;
    if (lVar5 == 0) {
      p_Var6 = (_List_node_base *)0x0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = auVar9._8_8_;
      auVar9 = auVar3 << 0x40;
    }
    else {
      p_Var6 = *(_List_node_base **)(pcVar8 + 0x18);
      if (p_Var6 != (_List_node_base *)0x0) {
        auVar9._8_8_ = &__libc_single_threaded;
        auVar9._0_8_ = lVar5;
        auVar2._8_8_ = &__libc_single_threaded;
        auVar2._0_8_ = lVar5;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var6->_M_prev = *(int *)&p_Var6->_M_prev + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var6->_M_prev = *(int *)&p_Var6->_M_prev + 1;
          auVar9 = auVar2;
        }
      }
    }
    _Var7._M_pi = auVar9._8_8_;
    (l->
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    )._M_impl._M_node.super__List_node_base._M_next = auVar9._0_8_;
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (l->
           super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
    (l->
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    )._M_impl._M_node.super__List_node_base._M_prev = p_Var6;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
    }
  }
  p_Var6 = (l->
           super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if ((p_Var6 != (_List_node_base *)0x0) && (p_Var6[2]._M_next != (_List_node_base *)0x0)) {
    sVar10.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var7._M_pi;
    sVar10.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)l;
    return (shared_ptr<SchemePort>)sVar10.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)skip
                 ,": bad port");
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_0017a350;
  __cxa_throw(this_00,&eval_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::shared_ptr<SchemePort>
get_output_port(const std::list<std::shared_ptr<SchemeObject>> &l, const std::string &proc, size_t skip)
{
    auto port = current_output_port;
    if(l.size() > skip)
        port = std::dynamic_pointer_cast<SchemePort>(*next(l.begin(), skip));
    if(!port || !port->output_stream)
        throw eval_error(proc + ": bad port");
    return port;
}